

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O0

ssize_t __thiscall HttpConn::write(HttpConn *this,int __fd,void *__buf,size_t __n)

{
  int fd;
  EventLoop *this_00;
  char *pcVar1;
  ssize_t sVar2;
  LogStream *this_01;
  HttpConn *pHVar3;
  element_type *peVar4;
  HttpConn *extraout_RAX;
  HttpConn *extraout_RAX_00;
  HttpConn *local_1050;
  code *local_1048;
  undefined8 local_1040;
  type local_1038;
  Functor local_1020;
  Logger local_ff0;
  int local_14;
  HttpConn *pHStack_10;
  int writeBytes;
  HttpConn *this_local;
  
  pHStack_10 = this;
  if (((this->writeable_ & 1U) != 0) && (this->write_idx_ != this->send_idx_)) {
    fd = this->fd_;
    pcVar1 = std::vector<char,_std::allocator<char>_>::data(&this->writeBuff_);
    sVar2 = writen(fd,pcVar1 + this->send_idx_,(long)(this->write_idx_ - this->send_idx_));
    local_14 = (int)sVar2;
    if (local_14 < 0) {
      Logger::Logger(&local_ff0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/HttpConn.cpp"
                     ,0x8c);
      this_01 = Logger::stream(&local_ff0);
      LogStream::operator<<(this_01,"Http Response Error: HttpConn::write()");
      Logger::~Logger(&local_ff0);
    }
    else {
      this->send_idx_ = local_14 + this->send_idx_;
    }
  }
  pHVar3 = this;
  if ((this->parseState_ == Finished) &&
     (pHVar3 = (HttpConn *)(ulong)(uint)this->write_idx_, this->write_idx_ == this->send_idx_)) {
    if ((this->connStatus_ == Connected) && ((this->linger_ & 1U) != 0)) {
      reset(this);
      peVar4 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->channel_);
      Channel::update(peVar4);
      pHVar3 = extraout_RAX;
    }
    else {
      peVar4 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->channel_);
      Channel::setEvent(peVar4,0);
      peVar4 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->channel_);
      Channel::update(peVar4);
      this_00 = this->loop_;
      local_1048 = close;
      local_1040 = 0;
      local_1050 = this;
      std::bind<void(HttpConn::*)(),HttpConn*>
                (&local_1038,(offset_in_HttpConn_to_subr *)&local_1048,&local_1050);
      std::function<void()>::function<std::_Bind<void(HttpConn::*(HttpConn*))()>,void>
                ((function<void()> *)&local_1020,&local_1038);
      EventLoop::runInLoop(this_00,&local_1020);
      std::function<void_()>::~function(&local_1020);
      pHVar3 = extraout_RAX_00;
    }
  }
  return (ssize_t)pHVar3;
}

Assistant:

void HttpConn::write() {
    if (writeable_ && write_idx_ != send_idx_) {
        int writeBytes;
        if ((writeBytes = writen(fd_, writeBuff_.data() + send_idx_, write_idx_ - send_idx_)) < 0) {
            LOG << "Http Response Error: HttpConn::write()";
        } else {
            send_idx_ += writeBytes;
        }
    }

    if (parseState_ == Finished && write_idx_ == send_idx_) {
        if (connStatus_ == Connected && linger_) {
            reset();
            channel_->update();
        } else {
            channel_->setEvent(0);
            channel_->update();
            loop_->runInLoop(std::bind(&HttpConn::close, this));
            return;
        }
    }
    //handleConn();
}